

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O3

ExprBase * EvaluateReturn(ExpressionEvalContext *ctx,ExprReturn *expression)

{
  uint uVar1;
  StackFrame *pSVar2;
  Allocator *pAVar3;
  SynBase *pSVar4;
  TypeBase *pTVar5;
  int iVar6;
  undefined4 extraout_var;
  ExprBase *pEVar7;
  char *msg;
  
  if (ctx->instructionsLimit <= ctx->instruction) {
    msg = "ERROR: instruction limit reached";
LAB_0024ee0d:
    Report(ctx,msg);
    return (ExprBase *)0x0;
  }
  ctx->instruction = ctx->instruction + 1;
  uVar1 = (ctx->stackFrames).count;
  if (uVar1 == 0) {
    __assert_fail("count > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                  ,0x172,
                  "T &SmallArray<ExpressionEvalContext::StackFrame *, 32>::back() [T = ExpressionEvalContext::StackFrame *, N = 32]"
                 );
  }
  pSVar2 = (ctx->stackFrames).data[uVar1 - 1];
  if (pSVar2->targetYield == 0) {
    pEVar7 = Evaluate(ctx,expression->value);
    if (pEVar7 == (ExprBase *)0x0) {
      return (ExprBase *)0x0;
    }
    if ((ctx->stackFrames).count == 0) {
      msg = "ERROR: no stack frame to return from";
      goto LAB_0024ee0d;
    }
    pSVar2->returnValue = pEVar7;
    if ((expression->coroutineStateUpdate != (ExprBase *)0x0) &&
       (pEVar7 = Evaluate(ctx,expression->coroutineStateUpdate), pEVar7 == (ExprBase *)0x0)) {
      return (ExprBase *)0x0;
    }
    if ((expression->closures != (ExprBase *)0x0) &&
       (pEVar7 = Evaluate(ctx,expression->closures), pEVar7 == (ExprBase *)0x0)) {
      return (ExprBase *)0x0;
    }
  }
  pAVar3 = ctx->ctx->allocator;
  iVar6 = (*pAVar3->_vptr_Allocator[2])(pAVar3,0x30);
  pEVar7 = (ExprBase *)CONCAT44(extraout_var,iVar6);
  pSVar4 = (expression->super_ExprBase).source;
  pTVar5 = ctx->ctx->typeVoid;
  pEVar7->typeID = 2;
  pEVar7->source = pSVar4;
  pEVar7->type = pTVar5;
  pEVar7->next = (ExprBase *)0x0;
  pEVar7->listed = false;
  pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e6b38;
  pEVar7 = CheckType(&expression->super_ExprBase,pEVar7);
  return pEVar7;
}

Assistant:

ExprBase* EvaluateReturn(ExpressionEvalContext &ctx, ExprReturn *expression)
{
	if(!AddInstruction(ctx))
		return NULL;

	ExpressionEvalContext::StackFrame *frame = ctx.stackFrames.back();

	if(frame->targetYield)
		return CheckType(expression, new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid));

	ExprBase *value = Evaluate(ctx, expression->value);

	if(!value)
		return NULL;

	if(ctx.stackFrames.empty())
		return Report(ctx, "ERROR: no stack frame to return from");

	frame->returnValue = value;

	if(expression->coroutineStateUpdate)
	{
		if(!Evaluate(ctx, expression->coroutineStateUpdate))
			return NULL;
	}

	if(expression->closures)
	{
		if(!Evaluate(ctx, expression->closures))
			return NULL;
	}

	return CheckType(expression, new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid));
}